

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexManipulator.cpp
# Opt level: O3

MultiIndexSet *
TasGrid::MultiIndexManipulations::selectFlaggedChildren
          (MultiIndexSet *__return_storage_ptr__,MultiIndexSet *mset,
          vector<bool,_std::allocator<bool>_> *flagged,
          vector<int,_std::allocator<int>_> *level_limits)

{
  size_t __n;
  pointer piVar1;
  MultiIndexSet *pMVar2;
  int iVar3;
  int *k;
  pointer piVar4;
  int *k_1;
  ulong uVar5;
  int *piVar6;
  int *piVar7;
  unsigned_long __n2;
  vector<int,_std::allocator<int>_> kid;
  allocator_type local_a1;
  size_type local_a0;
  ulong local_98;
  vector<int,_std::allocator<int>_> local_90;
  vector<bool,_std::allocator<bool>_> *local_78;
  undefined1 local_70 [16];
  pointer piStack_60;
  pointer local_58;
  pointer piStack_50;
  MultiIndexSet *local_48;
  size_t local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  local_a0 = mset->num_dimensions;
  local_98 = (ulong)(uint)mset->cache_num_indexes;
  local_70._8_8_ = 0;
  piStack_60 = (pointer)0x0;
  local_58 = (pointer)0x0;
  piStack_50 = (pointer)0x0;
  local_78 = flagged;
  local_70._0_8_ = local_a0;
  ::std::vector<int,_std::allocator<int>_>::vector(&local_90,local_a0,&local_a1);
  local_48 = __return_storage_ptr__;
  if ((level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start ==
      (level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    if (0 < (int)local_98) {
      __n = local_a0 * 4;
      uVar5 = 0;
      do {
        if (((local_78->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
             ._M_start.super__Bit_iterator_base._M_p[uVar5 >> 6 & 0x3ffffff] >> (uVar5 & 0x3f) & 1)
            != 0) {
          piVar6 = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar7 = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (local_a0 != 0) {
            memmove(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (mset->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + mset->num_dimensions * uVar5,__n);
            piVar6 = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar7 = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          }
          for (; piVar6 != piVar7; piVar6 = piVar6 + 1) {
            *piVar6 = *piVar6 + 1;
            iVar3 = MultiIndexSet::getSlot
                              (mset,local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            if (iVar3 == -1) {
              ::std::vector<int,std::allocator<int>>::
              _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                        ((vector<int,std::allocator<int>> *)&piStack_60,local_58,
                         local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + local_70._0_8_);
              local_70._8_8_ = local_70._8_8_ + 1;
            }
            *piVar6 = *piVar6 + -1;
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != local_98);
    }
  }
  else {
    local_38 = level_limits;
    if (0 < (int)local_98) {
      local_40 = local_a0 * 4;
      uVar5 = 0;
      do {
        if (((local_78->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
             ._M_start.super__Bit_iterator_base._M_p[uVar5 >> 6 & 0x3ffffff] >> (uVar5 & 0x3f) & 1)
            != 0) {
          if (local_a0 != 0) {
            memmove(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (mset->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + mset->num_dimensions * uVar5,local_40);
          }
          piVar1 = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start !=
              local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish) {
            piVar7 = (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            piVar4 = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            do {
              iVar3 = *piVar4;
              *piVar4 = iVar3 + 1;
              if (((*piVar7 == -1) || (iVar3 < *piVar7)) &&
                 (iVar3 = MultiIndexSet::getSlot
                                    (mset,local_90.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start), iVar3 == -1)) {
                ::std::vector<int,std::allocator<int>>::
                _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                          ((vector<int,std::allocator<int>> *)&piStack_60,local_58,
                           local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + local_70._0_8_);
                local_70._8_8_ = local_70._8_8_ + 1;
              }
              *piVar4 = *piVar4 + -1;
              piVar7 = piVar7 + 1;
              piVar4 = piVar4 + 1;
            } while (piVar4 != piVar1);
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != local_98);
    }
  }
  pMVar2 = local_48;
  MultiIndexSet::MultiIndexSet(local_48,(Data2D<int> *)local_70);
  if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (piStack_60 != (pointer)0x0) {
    operator_delete(piStack_60,(long)piStack_50 - (long)piStack_60);
  }
  return pMVar2;
}

Assistant:

MultiIndexSet selectFlaggedChildren(const MultiIndexSet &mset, const std::vector<bool> &flagged, const std::vector<int> &level_limits){
    size_t num_dimensions = mset.getNumDimensions();
    int n = mset.getNumIndexes();

    Data2D<int> children_unsorted(num_dimensions, 0);

    #ifdef _OPENMP
    #pragma omp parallel
    {
        Data2D<int> lrefined(num_dimensions, 0);
        std::vector<int> kid(num_dimensions);

        if (level_limits.empty()){
            #pragma omp for
            for(int i=0; i<n; i++){
                if (flagged[i]){
                    std::copy_n(mset.getIndex(i), num_dimensions, kid.data());
                    for(auto &k : kid){
                        k++;
                        if (mset.missing(kid)) lrefined.appendStrip(kid);
                        k--;
                    }
                }
            }
        }else{
            #pragma omp for
            for(int i=0; i<n; i++){
                if (flagged[i]){
                    std::copy_n(mset.getIndex(i), num_dimensions, kid.data());
                    auto ill = level_limits.begin();
                    for(auto &k : kid){
                        k++;
                        if (((*ill == -1) || (k <= *ill)) && mset.missing(kid))
                            lrefined.appendStrip(kid);
                        k--;
                        ill++;
                    }
                }
            }
        }

        #pragma omp critical
        {
            children_unsorted.append(lrefined);
        }
    }
    #else
    std::vector<int> kid(num_dimensions);

    if (level_limits.empty()){
        for(int i=0; i<n; i++){
            if (flagged[i]){
                std::copy_n(mset.getIndex(i), num_dimensions, kid.data());
                for(auto &k : kid){
                    k++;
                    if (mset.missing(kid)) children_unsorted.appendStrip(kid);
                    k--;
                }
            }
        }
    }else{
        for(int i=0; i<n; i++){
            if (flagged[i]){
                std::copy_n(mset.getIndex(i), num_dimensions, kid.data());
                auto ill = level_limits.begin();
                for(auto &k : kid){
                    k++;
                    if (((*ill == -1) || (k <= *ill)) && mset.missing(kid))
                        children_unsorted.appendStrip(kid);
                    k--;
                    ill++;
                }
            }
        }
    }
    #endif

    return MultiIndexSet(children_unsorted);
}